

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O0

int Abc_NtkSuperChoiceLut(Abc_Ntk_t *pNtk,int nLutSize,int nCutSizeMax,int fVerbose)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_ManScl_t *p;
  Cut_Man_t *pManCuts_00;
  Abc_ManCut_t *p_00;
  Vec_Ptr_t *pVVar4;
  ProgressBar *p_01;
  Abc_Obj_t *pObj_00;
  uint local_7c;
  uint local_78;
  int nNodesUsed;
  int nNodesExist;
  int nNodesDec;
  int nNodesTried;
  int nNodes;
  int LevelMax;
  int i;
  Abc_Obj_t *pObjTop;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Cut_Man_t *pManCuts;
  Abc_ManScl_t *pManScl;
  Abc_ManCut_t *pManCut;
  ProgressBar *pProgress;
  int fVerbose_local;
  int nCutSizeMax_local;
  int nLutSize_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsSopLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                  ,0x5b,"int Abc_NtkSuperChoiceLut(Abc_Ntk_t *, int, int, int)");
  }
  if ((nLutSize < 3) || (6 < nLutSize)) {
    printf("LUT size (%d) does not belong to the interval: 3 <= LUT size <= %d\n",
           (ulong)(uint)nLutSize,6);
    pNtk_local._4_4_ = 0;
  }
  else if ((nLutSize < nCutSizeMax) && (nCutSizeMax < 0x10)) {
    if (6 < nLutSize) {
      __assert_fail("nLutSize <= SCL_LUT_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                    ,0x67,"int Abc_NtkSuperChoiceLut(Abc_Ntk_t *, int, int, int)");
    }
    if (0xf < nCutSizeMax) {
      __assert_fail("nCutSizeMax <= SCL_VARS_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLut.c"
                    ,0x68,"int Abc_NtkSuperChoiceLut(Abc_Ntk_t *, int, int, int)");
    }
    local_7c = 0;
    local_78 = 0;
    nNodesUsed = 0;
    nNodesExist = 0;
    for (nNodes = 0; iVar1 = Abc_NtkCiNum(pNtk), nNodes < iVar1; nNodes = nNodes + 1) {
      pAVar3 = Abc_NtkCi(pNtk,nNodes);
      *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xfff;
    }
    p = Abc_ManSclStart(nLutSize,nCutSizeMax,1000);
    pManCuts_00 = Abc_NtkStartCutManForScl(pNtk,nLutSize);
    p_00 = Abc_NtkManCutStart(nCutSizeMax,100000,100000,100000);
    s_pLeaves = Abc_NtkManCutReadCutSmall(p_00);
    pVVar4 = Abc_NtkManCutReadVisited(p_00);
    p->vVolume = pVVar4;
    iVar1 = Abc_NtkObjNumMax(pNtk);
    p_01 = Extra_ProgressBarStart(_stdout,iVar1);
    for (nNodes = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), nNodes < iVar2; nNodes = nNodes + 1) {
      pAVar3 = Abc_NtkObj(pNtk,nNodes);
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        Extra_ProgressBarUpdate(p_01,nNodes,(char *)0x0);
        if (iVar1 <= nNodes) break;
        iVar2 = Abc_ObjFaninNum(pAVar3);
        if (iVar2 == 2) {
          nNodesExist = nNodesExist + 1;
          Abc_NodeLutMap(pManCuts_00,pAVar3);
          pVVar4 = Abc_NodeFindCut(p_00,pAVar3,0);
          p->vLeaves = pVVar4;
          iVar2 = Vec_PtrSize(p->vLeaves);
          if ((nLutSize < iVar2) && (iVar2 = Vec_PtrSize(p->vVolume), iVar2 < 0x3e9)) {
            nNodesUsed = nNodesUsed + 1;
            pObj_00 = Abc_NodeSuperChoiceLut(p,pAVar3);
            if (pObj_00 != (Abc_Obj_t *)0x0) {
              local_78 = local_78 + 1;
              if (*(uint *)&pObj_00->field_0x14 >> 0xc < *(uint *)&pAVar3->field_0x14 >> 0xc) {
                *(uint *)&pAVar3->field_0x14 =
                     *(uint *)&pAVar3->field_0x14 & 0xfff |
                     *(uint *)&pObj_00->field_0x14 & 0xfffff000;
                local_7c = local_7c + 1;
              }
              else {
                Abc_NtkDeleteObj_rec(pObj_00,1);
              }
            }
          }
        }
      }
    }
    Extra_ProgressBarStop(p_01);
    Abc_ManSclStop(p);
    Abc_NtkManCutStop(p_00);
    Cut_ManStop(pManCuts_00);
    nNodesTried = 0;
    for (nNodes = 0; iVar1 = Abc_NtkCoNum(pNtk), nNodes < iVar1; nNodes = nNodes + 1) {
      pAVar3 = Abc_NtkCo(pNtk,nNodes);
      pObjTop = Abc_ObjFanin0(pAVar3);
      iVar1 = Abc_ObjFaninNum(pObjTop);
      if (iVar1 == 1) {
        pObjTop = Abc_ObjFanin0(pObjTop);
      }
      nNodesTried = Abc_MaxInt(nNodesTried,*(uint *)&pObjTop->field_0x14 >> 0xc);
    }
    if (fVerbose != 0) {
      printf("Try = %d. Dec = %d. Exist = %d. Use = %d. SUPER = %d levels of %d-LUTs.\n",
             (ulong)(uint)nNodesExist,(ulong)(uint)nNodesUsed,(ulong)local_78,(ulong)local_7c,
             (ulong)(uint)nNodesTried,nLutSize);
    }
    for (nNodes = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), nNodes < iVar1; nNodes = nNodes + 1) {
      pAVar3 = Abc_NtkObj(pNtk,nNodes);
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        pAVar3->pNext = (Abc_Obj_t *)0x0;
      }
    }
    iVar1 = Abc_NtkCheck(pNtk);
    if (iVar1 == 0) {
      printf("Abc_NtkSuperChoiceLut: The network check has failed.\n");
      pNtk_local._4_4_ = 0;
    }
    else {
      pNtk_local._4_4_ = 1;
    }
  }
  else {
    printf("Cut size (%d) does not belong to the interval: LUT size (%d) < Cut size <= %d\n",
           (ulong)(uint)nCutSizeMax,(ulong)(uint)nLutSize,0xf);
    pNtk_local._4_4_ = 0;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkSuperChoiceLut( Abc_Ntk_t * pNtk, int nLutSize, int nCutSizeMax, int fVerbose )
{
    ProgressBar * pProgress;
    Abc_ManCut_t * pManCut;
    Abc_ManScl_t * pManScl;
    Cut_Man_t * pManCuts;
    Abc_Obj_t * pObj, * pFanin, * pObjTop;
    int i, LevelMax, nNodes;
    int nNodesTried, nNodesDec, nNodesExist, nNodesUsed;

    assert( Abc_NtkIsSopLogic(pNtk) );
    if ( nLutSize < 3 || nLutSize > SCL_LUT_MAX )
    {
        printf( "LUT size (%d) does not belong to the interval: 3 <= LUT size <= %d\n", nLutSize, SCL_LUT_MAX );
        return 0;
    }
    if ( nCutSizeMax <= nLutSize || nCutSizeMax > SCL_VARS_MAX )
    {
        printf( "Cut size (%d) does not belong to the interval: LUT size (%d) < Cut size <= %d\n", nCutSizeMax, nLutSize, SCL_VARS_MAX );
        return 0;
    }

    assert( nLutSize <= SCL_LUT_MAX );
    assert( nCutSizeMax <= SCL_VARS_MAX );
    nNodesTried = nNodesDec = nNodesExist = nNodesUsed = 0;

    // set the delays of the CIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->Level = 0;

//Abc_NtkLevel( pNtk );
 
    // start the managers
    pManScl = Abc_ManSclStart( nLutSize, nCutSizeMax, 1000 );
    pManCuts = Abc_NtkStartCutManForScl( pNtk, nLutSize );
    pManCut = Abc_NtkManCutStart( nCutSizeMax, 100000, 100000, 100000 );
    s_pLeaves = Abc_NtkManCutReadCutSmall( pManCut );
    pManScl->vVolume = Abc_NtkManCutReadVisited( pManCut );

    // process each internal node (assuming topological order of nodes!!!)
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
//        if ( i != nNodes-1 )
//            continue;
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        if ( i >= nNodes )
            break;
        if ( Abc_ObjFaninNum(pObj) != 2 )
            continue;
        nNodesTried++;

        // map this node using regular cuts
//        pObj->Level = 0;
        Abc_NodeLutMap( pManCuts, pObj );
        // compute the cut
        pManScl->vLeaves = Abc_NodeFindCut( pManCut, pObj, 0 );
        if ( Vec_PtrSize(pManScl->vLeaves) <= nLutSize )
            continue;
        // get the volume of the cut
        if ( Vec_PtrSize(pManScl->vVolume) > SCL_NODE_MAX )
            continue;
        nNodesDec++;

        // decompose the cut
        pObjTop = Abc_NodeSuperChoiceLut( pManScl, pObj );
        if ( pObjTop == NULL )
            continue;
        nNodesExist++;

        // if there is no delay improvement, skip; otherwise, update level
        if ( pObjTop->Level >= pObj->Level )
        {
            Abc_NtkDeleteObj_rec( pObjTop, 1 );
            continue;
        }
        pObj->Level = pObjTop->Level;
        nNodesUsed++;
    }
    Extra_ProgressBarStop( pProgress );

    // delete the managers
    Abc_ManSclStop( pManScl );
    Abc_NtkManCutStop( pManCut );
    Cut_ManStop( pManCuts );

    // get the largest arrival time
    LevelMax = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pFanin = Abc_ObjFanin0( pObj );
        // skip inv/buf
        if ( Abc_ObjFaninNum(pFanin) == 1 )
            pFanin = Abc_ObjFanin0( pFanin );
        // get the new level
        LevelMax = Abc_MaxInt( LevelMax, (int)pFanin->Level );
    }

    if ( fVerbose )
    printf( "Try = %d. Dec = %d. Exist = %d. Use = %d. SUPER = %d levels of %d-LUTs.\n", 
        nNodesTried, nNodesDec, nNodesExist, nNodesUsed, LevelMax, nLutSize );
//    if ( fVerbose )
//    printf( "The network is superchoiced for %d levels of %d-LUTs.\n", LevelMax, nLutSize );

    // clean the data field
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->pNext = NULL;

    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkSuperChoiceLut: The network check has failed.\n" );
        return 0;
    }
    return 1;
}